

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformationImplementation::ExtractValueFromSysCtl_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *word)

{
  long lVar1;
  long lVar2;
  string *psVar3;
  allocator<char> local_19;
  
  psVar3 = &this->SysCtlBuffer;
  lVar1 = std::__cxx11::string::find((char *)psVar3,(ulong)word);
  if (lVar1 != -1) {
    lVar1 = std::__cxx11::string::find((char *)psVar3,0x7c10c0);
    lVar2 = std::__cxx11::string::find((char)psVar3,10);
    if (lVar2 != -1 && lVar1 != -1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar3);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ExtractValueFromSysCtl(
  const char* word)
{
  size_t pos = this->SysCtlBuffer.find(word);
  if (pos != std::string::npos) {
    pos = this->SysCtlBuffer.find(": ", pos);
    size_t pos2 = this->SysCtlBuffer.find('\n', pos);
    if (pos != std::string::npos && pos2 != std::string::npos) {
      return this->SysCtlBuffer.substr(pos + 2, pos2 - pos - 2);
    }
  }
  return "";
}